

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O2

void __thiscall CBinds::UnbindAll(CBinds *this)

{
  int i;
  long lVar1;
  long lVar2;
  char (*paacVar3) [4] [128];
  
  paacVar3 = this->m_aaaKeyBindings;
  for (lVar1 = 0; lVar1 != 0x1da; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 0x200; lVar2 = lVar2 + 0x80) {
      (*paacVar3)[0][lVar2] = '\0';
    }
    paacVar3 = paacVar3 + 1;
  }
  return;
}

Assistant:

void CBinds::UnbindAll()
{
	for(int i = 0; i < KEY_LAST; i++)
		for(int m = 0; m < MODIFIER_COUNT; m++)
			m_aaaKeyBindings[i][m][0] = 0;
}